

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorExport.cpp
# Opt level: O1

HelicsTranslator
helicsFederateRegisterTranslator
          (HelicsFederate fed,HelicsTranslatorTypes type,char *name,HelicsError *err)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_> *puVar2;
  ulong uVar3;
  Federate *pFVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  size_t sVar6;
  Filter *pFVar7;
  ulong uVar8;
  const_iterator __position;
  _Alloc_hider _Var9;
  TranslatorObject *pTVar10;
  FedObject *fedObj;
  string_view translatorName;
  __single_object trans;
  _Head_base<0UL,_helics::TranslatorObject_*,_false> local_58;
  TranslatorObject *local_50;
  Federate *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  getFedSharedPtr(&local_48,(HelicsError *)fed);
  pFVar4 = local_48;
  if (local_48 == (Federate *)0x0) {
    pTVar10 = (TranslatorObject *)0x0;
  }
  else {
    local_50 = (TranslatorObject *)operator_new(0x38);
    (local_50->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (local_50->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (local_50->mTrans)._M_t.
    super___uniq_ptr_impl<helics::Translator,_std::default_delete<helics::Translator>_>._M_t.
    super__Tuple_impl<0UL,_helics::Translator_*,_std::default_delete<helics::Translator>_>.
    super__Head_base<0UL,_helics::Translator_*,_false>._M_head_impl = (Translator *)0x0;
    (local_50->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_50->custom = false;
    *(undefined3 *)&local_50->field_0x1 = 0;
    local_50->valid = 0;
    local_50->transPtr = (Translator *)0x0;
    (local_50->corePtr).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    sVar6 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var9 = gHelicsEmptyStr_abi_cxx11_._M_dataplus;
    if (name != (char *)0x0) {
      sVar6 = strlen(name);
      _Var9._M_p = name;
    }
    local_38 = 0;
    uStack_30 = 0;
    translatorName._M_str = _Var9._M_p;
    translatorName._M_len = sVar6;
    pFVar7 = helics::Federate::registerTranslator
                       (pFVar4,type,translatorName,(string_view)ZEXT816(0),(string_view)ZEXT816(0));
    p_Var5 = p_Stack_40;
    pFVar4 = local_48;
    local_50->transPtr = (Translator *)pFVar7;
    local_48 = (Federate *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this = (local_50->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
    (local_50->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         pFVar4;
    (local_50->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = p_Var5;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
    }
    pTVar10 = local_50;
    local_50->custom = type == HELICS_TRANSLATOR_TYPE_CUSTOM;
    local_58._M_head_impl = local_50;
    local_50 = (TranslatorObject *)0x0;
    pTVar10->valid = -0x4c83cad2;
    __position._M_current =
         *(unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_> **)
          ((long)fed + 0xb0);
    puVar2 = *(unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
               **)((long)fed + 0xb8);
    if ((__position._M_current == puVar2) ||
       (iVar1 = (pTVar10->transPtr->super_Interface).handle.hid,
       ((puVar2[-1]._M_t.
         super___uniq_ptr_impl<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
         ._M_t.
         super__Tuple_impl<0UL,_helics::TranslatorObject_*,_std::default_delete<helics::TranslatorObject>_>
         .super__Head_base<0UL,_helics::TranslatorObject_*,_false>._M_head_impl)->transPtr->
       super_Interface).handle.hid < iVar1)) {
      std::
      vector<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>,std::allocator<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>>>
      ::
      emplace_back<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>>
                ((vector<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>,std::allocator<std::unique_ptr<helics::TranslatorObject,std::default_delete<helics::TranslatorObject>>>>
                  *)((long)fed + 0xb0),
                 (unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
                  *)&local_58);
    }
    else {
      uVar8 = (long)puVar2 - (long)__position._M_current >> 3;
      while (uVar3 = uVar8, 0 < (long)uVar3) {
        uVar8 = uVar3 >> 1;
        if (((__position._M_current[uVar8]._M_t.
              super___uniq_ptr_impl<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::TranslatorObject_*,_std::default_delete<helics::TranslatorObject>_>
              .super__Head_base<0UL,_helics::TranslatorObject_*,_false>._M_head_impl)->transPtr->
            super_Interface).handle.hid <= iVar1) {
          __position._M_current = __position._M_current + uVar8 + 1;
          uVar8 = ~uVar8 + uVar3;
        }
      }
      std::
      vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
      ::_M_insert_rval((vector<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>,_std::allocator<std::unique_ptr<helics::TranslatorObject,_std::default_delete<helics::TranslatorObject>_>_>_>
                        *)((long)fed + 0xb0),__position,(value_type *)&local_58);
    }
    if (local_58._M_head_impl != (TranslatorObject *)0x0) {
      std::default_delete<helics::TranslatorObject>::operator()
                ((default_delete<helics::TranslatorObject> *)&local_58,local_58._M_head_impl);
    }
    local_58._M_head_impl = (TranslatorObject *)0x0;
    if (local_50 != (TranslatorObject *)0x0) {
      std::default_delete<helics::TranslatorObject>::operator()
                ((default_delete<helics::TranslatorObject> *)&local_50,local_50);
    }
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  return pTVar10;
}

Assistant:

HELICS_EXPORT HelicsTranslator helicsFederateRegisterTranslator(HelicsFederate fed,
                                                                HelicsTranslatorTypes type,
                                                                const char* name,
                                                                HelicsError* err)
{
    // now generate a generic subscription
    auto fedObj = getFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }

    try {
        auto trans = std::make_unique<helics::TranslatorObject>();
        trans->transPtr = &fedObj->registerTranslator(type, AS_STRING_VIEW(name));
        trans->fedptr = std::move(fedObj);
        trans->custom = (type == HELICS_TRANSLATOR_TYPE_CUSTOM);
        return federateAddTranslator(fed, std::move(trans));
    }
    catch (...) {
        helicsErrorHandler(err);
    }
    return nullptr;
}